

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

Regexp * re2::Regexp::Parse(StringPiece *s,ParseFlags global_flags,RegexpStatus *status)

{
  Regexp *pRVar1;
  bool bVar2;
  ParseFlags PVar3;
  int iVar4;
  string *this;
  size_type sVar5;
  const_reference pcVar6;
  const_pointer pcVar7;
  const_pointer pcVar8;
  const_pointer pcVar9;
  StringPiece *s_00;
  CharClassBuilder *pCVar10;
  ParseState *pPVar11;
  ParseState *pPVar12;
  ParseState *in_RDX;
  ParseFlags in_ESI;
  undefined8 *in_RDI;
  Rune r_2;
  Regexp *re_2;
  UGroup *g;
  Regexp *re_1;
  Rune r_3;
  bool nongreedy_1;
  StringPiece opstr_1;
  int hi;
  int lo;
  bool nongreedy;
  StringPiece opstr;
  RegexpOp op;
  Regexp *re;
  Rune r_1;
  StringPiece isunary;
  StringPiece lastunary;
  Rune r;
  string *tmp;
  StringPiece t;
  ParseState ps;
  RegexpStatus xstatus;
  ParseState *in_stack_fffffffffffffbd8;
  undefined6 in_stack_fffffffffffffbe0;
  undefined1 in_stack_fffffffffffffbe6;
  undefined1 in_stack_fffffffffffffbe7;
  ParseState *in_stack_fffffffffffffbe8;
  int in_stack_fffffffffffffbf0;
  ParseFlags in_stack_fffffffffffffbf4;
  ParseState *in_stack_fffffffffffffbf8;
  ParseState *in_stack_fffffffffffffc00;
  int in_stack_fffffffffffffc08;
  ParseFlags in_stack_fffffffffffffc0c;
  ParseState *in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc18;
  ParseFlags in_stack_fffffffffffffc1c;
  ParseFlags in_stack_fffffffffffffc20;
  ParseFlags in_stack_fffffffffffffc24;
  ParseState *in_stack_fffffffffffffc28;
  ParseState *in_stack_fffffffffffffc30;
  ParseFlags in_stack_fffffffffffffc38;
  undefined4 in_stack_fffffffffffffc3c;
  ParseStatus in_stack_fffffffffffffc40;
  ParseFlags in_stack_fffffffffffffc44;
  ParseState *in_stack_fffffffffffffc48;
  ParseFlags in_stack_fffffffffffffc50;
  ParseFlags in_stack_fffffffffffffc54;
  ParseFlags in_stack_fffffffffffffc58;
  ParseFlags in_stack_fffffffffffffc5c;
  CharClassBuilder *in_stack_fffffffffffffc60;
  CharClassBuilder *in_stack_fffffffffffffc68;
  RegexpStatus *in_stack_fffffffffffffca0;
  Regexp **in_stack_fffffffffffffca8;
  undefined7 in_stack_fffffffffffffcb0;
  undefined1 in_stack_fffffffffffffcb7;
  ParseState *in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe14;
  StringPiece local_180;
  StringPiece local_170;
  undefined1 local_159;
  StringPiece local_158;
  StringPiece local_140;
  StringPiece local_130;
  undefined1 local_119;
  StringPiece local_118;
  undefined4 local_fc;
  StringPiece local_f0;
  StringPiece local_d8;
  StringPiece local_c8;
  undefined4 local_b8;
  const_pointer local_b0;
  size_type local_a8;
  string *local_a0;
  StringPiece local_98 [2];
  ParseState local_70;
  ParseState local_40;
  undefined8 *local_10;
  Regexp *local_8;
  
  local_40.stacktop_ = (Regexp *)in_RDX;
  local_40.rune_max_ = in_ESI;
  local_10 = in_RDI;
  RegexpStatus::RegexpStatus
            ((RegexpStatus *)
             CONCAT17(in_stack_fffffffffffffbe7,
                      CONCAT16(in_stack_fffffffffffffbe6,in_stack_fffffffffffffbe0)));
  if ((ParseState *)local_40.stacktop_ == (ParseState *)0x0) {
    local_40.stacktop_ = (Regexp *)&local_40;
  }
  ParseState::ParseState
            ((ParseState *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
             (ParseFlags)((ulong)in_stack_fffffffffffffbe8 >> 0x20),
             (StringPiece *)
             CONCAT17(in_stack_fffffffffffffbe7,
                      CONCAT16(in_stack_fffffffffffffbe6,in_stack_fffffffffffffbe0)),
             (RegexpStatus *)in_stack_fffffffffffffbd8);
  local_98[0].data_ = (const_pointer)*local_10;
  local_98[0].size_ = local_10[1];
  PVar3 = operator&(local_40.rune_max_,Latin1);
  if (PVar3 != NoParseFlags) {
    this = (string *)operator_new(0x20);
    std::__cxx11::string::string(this);
    local_a0 = this;
    ConvertLatin1ToUTF8((StringPiece *)in_stack_fffffffffffffc00,(string *)in_stack_fffffffffffffbf8
                       );
    RegexpStatus::set_tmp
              ((RegexpStatus *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
               (string *)in_stack_fffffffffffffbe8);
    StringPiece::StringPiece
              ((StringPiece *)
               CONCAT17(in_stack_fffffffffffffbe7,
                        CONCAT16(in_stack_fffffffffffffbe6,in_stack_fffffffffffffbe0)),
               (string *)in_stack_fffffffffffffbd8);
    local_98[0].data_ = local_b0;
    local_98[0].size_ = local_a8;
  }
  PVar3 = operator&(local_40.rune_max_,Literal);
  if (PVar3 == NoParseFlags) {
    StringPiece::StringPiece(&local_c8);
    while (sVar5 = StringPiece::size(local_98), sVar5 != 0) {
      StringPiece::StringPiece(&local_d8);
      pcVar6 = StringPiece::operator[](local_98,0);
      pPVar12 = (ParseState *)(ulong)((int)*pcVar6 - 0x24);
      switch(pPVar12) {
      case (ParseState *)0x0:
        bVar2 = ParseState::PushDollar(in_stack_fffffffffffffbe8);
        if (!bVar2) {
          local_8 = (Regexp *)0x0;
          goto LAB_0025201b;
        }
        StringPiece::remove_prefix(local_98,1);
        break;
      default:
        in_stack_fffffffffffffe14 =
             StringPieceToRune((Rune *)in_stack_fffffffffffffc28,
                               (StringPiece *)
                               CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                               (RegexpStatus *)
                               CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
        if (in_stack_fffffffffffffe14 < 0) {
          local_8 = (Regexp *)0x0;
          goto LAB_0025201b;
        }
        bVar2 = ParseState::PushLiteral
                          ((ParseState *)
                           CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                           (Rune)((ulong)in_stack_fffffffffffffc30 >> 0x20));
        in_stack_fffffffffffffe10 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffe10);
        if (!bVar2) {
          local_8 = (Regexp *)0x0;
          goto LAB_0025201b;
        }
        break;
      case (ParseState *)0x4:
        PVar3 = ParseState::flags(&local_70);
        PVar3 = operator&(PVar3,PerlX);
        if (((PVar3 == NoParseFlags) || (sVar5 = StringPiece::size(local_98), sVar5 < 2)) ||
           (pcVar6 = StringPiece::operator[](local_98,1), *pcVar6 != '?')) {
          PVar3 = ParseState::flags(&local_70);
          PVar3 = operator&(PVar3,NeverCapture);
          if (PVar3 == NoParseFlags) {
            StringPiece::StringPiece(&local_f0);
            bVar2 = ParseState::DoLeftParen
                              (in_stack_fffffffffffffc10,
                               (StringPiece *)
                               CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
            if (((bVar2 ^ 0xffU) & 1) != 0) {
              local_8 = (Regexp *)0x0;
              goto LAB_0025201b;
            }
          }
          else {
            bVar2 = ParseState::DoLeftParenNoCapture(in_stack_fffffffffffffc00);
            if (!bVar2) {
              local_8 = (Regexp *)0x0;
              goto LAB_0025201b;
            }
          }
          StringPiece::remove_prefix(local_98,1);
        }
        else {
          bVar2 = ParseState::ParsePerlFlags
                            (pPVar12,(StringPiece *)
                                     CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
          if (!bVar2) {
            local_8 = (Regexp *)0x0;
            goto LAB_0025201b;
          }
        }
        break;
      case (ParseState *)0x5:
        bVar2 = ParseState::DoRightParen(in_stack_fffffffffffffbf8);
        if (!bVar2) {
          local_8 = (Regexp *)0x0;
          goto LAB_0025201b;
        }
        StringPiece::remove_prefix(local_98,1);
        break;
      case (ParseState *)0x6:
        local_fc = 7;
        goto LAB_00250ff7;
      case (ParseState *)0x7:
        local_fc = 8;
        goto LAB_00250ff7;
      case (ParseState *)0xa:
        bVar2 = ParseState::PushDot((ParseState *)
                                    CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
        if (!bVar2) {
          local_8 = (Regexp *)0x0;
          goto LAB_0025201b;
        }
        StringPiece::remove_prefix(local_98,1);
        break;
      case (ParseState *)0x1b:
        local_fc = 9;
LAB_00250ff7:
        local_118.data_ = local_98[0].data_;
        local_118.size_ = local_98[0].size_;
        local_119 = 0;
        StringPiece::remove_prefix(local_98,1);
        PVar3 = ParseState::flags(&local_70);
        PVar3 = operator&(PVar3,PerlX);
        if (PVar3 != NoParseFlags) {
          sVar5 = StringPiece::size(local_98);
          if ((sVar5 != 0) && (pcVar6 = StringPiece::operator[](local_98,0), *pcVar6 == '?')) {
            local_119 = 1;
            StringPiece::remove_prefix(local_98,1);
          }
          sVar5 = StringPiece::size(&local_c8);
          if (sVar5 != 0) {
            RegexpStatus::set_code((RegexpStatus *)local_40.stacktop_,kRegexpRepeatOp);
            pRVar1 = local_40.stacktop_;
            pcVar7 = StringPiece::data(&local_c8);
            pcVar8 = StringPiece::data(local_98);
            pcVar9 = StringPiece::data(&local_c8);
            StringPiece::StringPiece(&local_130,pcVar7,(long)pcVar8 - (long)pcVar9);
            RegexpStatus::set_error_arg((RegexpStatus *)pRVar1,&local_130);
            local_8 = (Regexp *)0x0;
            goto LAB_0025201b;
          }
        }
        pcVar7 = StringPiece::data(&local_118);
        pcVar8 = StringPiece::data(local_98);
        pcVar9 = StringPiece::data(&local_118);
        StringPiece::StringPiece(&local_140,pcVar7,(long)pcVar8 - (long)pcVar9);
        local_118.data_ = local_140.data_;
        local_118.size_ = local_140.size_;
        bVar2 = ParseState::PushRepeatOp
                          (in_stack_fffffffffffffc28,in_stack_fffffffffffffc24,
                           (StringPiece *)
                           CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
                           SUB81((ulong)in_stack_fffffffffffffc10 >> 0x38,0));
        if (!bVar2) {
          local_8 = (Regexp *)0x0;
          goto LAB_0025201b;
        }
        local_d8.data_ = local_118.data_;
        local_d8.size_ = local_118.size_;
        break;
      case (ParseState *)0x37:
        bVar2 = ParseState::ParseCharClass
                          (in_stack_fffffffffffffcb8,
                           (StringPiece *)
                           CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0),
                           in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
        if (!bVar2) {
          local_8 = (Regexp *)0x0;
          goto LAB_0025201b;
        }
        bVar2 = ParseState::PushRegexp
                          ((ParseState *)
                           CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                           (Regexp *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
        if (!bVar2) {
          local_8 = (Regexp *)0x0;
          goto LAB_0025201b;
        }
        break;
      case (ParseState *)0x38:
        PVar3 = ParseState::flags(&local_70);
        PVar3 = operator&(PVar3,PerlB);
        if (((PVar3 == NoParseFlags) || (sVar5 = StringPiece::size(local_98), sVar5 < 2)) ||
           ((pcVar6 = StringPiece::operator[](local_98,1), *pcVar6 != 'b' &&
            (pcVar6 = StringPiece::operator[](local_98,1), *pcVar6 != 'B')))) {
          PVar3 = ParseState::flags(&local_70);
          PVar3 = operator&(PVar3,PerlX);
          if ((PVar3 == NoParseFlags) || (sVar5 = StringPiece::size(local_98), sVar5 < 2)) {
LAB_00251aff:
            s_00 = (StringPiece *)StringPiece::size(local_98);
            if (((StringPiece *)0x1 < s_00) &&
               ((pcVar6 = StringPiece::operator[](local_98,1), *pcVar6 == 'p' ||
                (in_stack_fffffffffffffc68 = (CharClassBuilder *)StringPiece::operator[](local_98,1)
                , (char)in_stack_fffffffffffffc68->upper_ == 'P')))) {
              PVar3 = (ParseFlags)((ulong)pcVar6 >> 0x20);
              pCVar10 = (CharClassBuilder *)operator_new(0x28);
              in_stack_fffffffffffffc5c = ParseState::flags(&local_70);
              in_stack_fffffffffffffc58 = operator~(FoldCase);
              in_stack_fffffffffffffc54 =
                   operator&(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58);
              Regexp((Regexp *)
                     CONCAT17(in_stack_fffffffffffffbe7,
                              CONCAT16(in_stack_fffffffffffffbe6,in_stack_fffffffffffffbe0)),
                     (RegexpOp)((ulong)in_stack_fffffffffffffbd8 >> 0x20),
                     (ParseFlags)in_stack_fffffffffffffbd8);
              in_stack_fffffffffffffc60 = pCVar10;
              in_stack_fffffffffffffc48 = (ParseState *)operator_new(0x40);
              CharClassBuilder::CharClassBuilder
                        ((CharClassBuilder *)
                         CONCAT17(in_stack_fffffffffffffbe7,
                                  CONCAT16(in_stack_fffffffffffffbe6,in_stack_fffffffffffffbe0)));
              (pCVar10->ranges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)in_stack_fffffffffffffc48;
              in_stack_fffffffffffffc44 = ParseState::flags(&local_70);
              in_stack_fffffffffffffc40 =
                   ParseUnicodeGroup(s_00,PVar3,in_stack_fffffffffffffc68,
                                     (RegexpStatus *)in_stack_fffffffffffffc60);
              if (in_stack_fffffffffffffc40 == kParseOk) {
                bVar2 = ParseState::PushRegexp
                                  ((ParseState *)
                                   CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                                   (Regexp *)
                                   CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
                in_stack_fffffffffffffc3c = CONCAT13(bVar2,(int3)in_stack_fffffffffffffc3c);
                if (bVar2) break;
                local_8 = (Regexp *)0x0;
                goto LAB_0025201b;
              }
              if (in_stack_fffffffffffffc40 == kParseError) {
                Decref((Regexp *)in_stack_fffffffffffffc30);
                local_8 = (Regexp *)0x0;
                goto LAB_0025201b;
              }
              if (in_stack_fffffffffffffc40 == kParseNothing) {
                Decref((Regexp *)in_stack_fffffffffffffc30);
              }
            }
            in_stack_fffffffffffffc38 = ParseState::flags(&local_70);
            in_stack_fffffffffffffc30 =
                 (ParseState *)
                 MaybeParsePerlCCEscape
                           ((StringPiece *)in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf4);
            if (in_stack_fffffffffffffc30 == (ParseState *)0x0) {
              in_stack_fffffffffffffbe8 = (ParseState *)local_40.stacktop_;
              in_stack_fffffffffffffbf0 = ParseState::rune_max(&local_70);
              in_stack_fffffffffffffbe7 =
                   ParseEscape((StringPiece *)in_stack_fffffffffffffc68,
                               (Rune *)in_stack_fffffffffffffc60,
                               (RegexpStatus *)
                               CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                               in_stack_fffffffffffffc54);
              if (!(bool)in_stack_fffffffffffffbe7) {
                local_8 = (Regexp *)0x0;
                goto LAB_0025201b;
              }
              in_stack_fffffffffffffbe6 =
                   ParseState::PushLiteral
                             ((ParseState *)
                              CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                              (Rune)((ulong)in_stack_fffffffffffffc30 >> 0x20));
              if (!(bool)in_stack_fffffffffffffbe6) {
                local_8 = (Regexp *)0x0;
                goto LAB_0025201b;
              }
            }
            else {
              pPVar12 = in_stack_fffffffffffffc30;
              pPVar11 = (ParseState *)operator_new(0x28);
              in_stack_fffffffffffffc24 = ParseState::flags(&local_70);
              in_stack_fffffffffffffc20 = operator~(FoldCase);
              in_stack_fffffffffffffc1c =
                   operator&(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20);
              Regexp((Regexp *)
                     CONCAT17(in_stack_fffffffffffffbe7,
                              CONCAT16(in_stack_fffffffffffffbe6,in_stack_fffffffffffffbe0)),
                     (RegexpOp)((ulong)in_stack_fffffffffffffbd8 >> 0x20),
                     (ParseFlags)in_stack_fffffffffffffbd8);
              in_stack_fffffffffffffc28 = pPVar11;
              in_stack_fffffffffffffc10 = (ParseState *)operator_new(0x40);
              CharClassBuilder::CharClassBuilder
                        ((CharClassBuilder *)
                         CONCAT17(in_stack_fffffffffffffbe7,
                                  CONCAT16(in_stack_fffffffffffffbe6,in_stack_fffffffffffffbe0)));
              pPVar11->stacktop_ = (Regexp *)in_stack_fffffffffffffc10;
              in_stack_fffffffffffffbf8 = (ParseState *)pPVar11->stacktop_;
              in_stack_fffffffffffffc08 = *(int *)&(in_stack_fffffffffffffc30->whole_regexp_).data_;
              in_stack_fffffffffffffc0c = ParseState::flags(&local_70);
              AddUGroup(in_stack_fffffffffffffc60,
                        (UGroup *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                        in_stack_fffffffffffffc54,in_stack_fffffffffffffc50);
              bVar2 = ParseState::PushRegexp
                                ((ParseState *)
                                 CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                                 (Regexp *)
                                 CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
              in_stack_fffffffffffffbf4 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffbf4);
              in_stack_fffffffffffffc00 = in_stack_fffffffffffffc30;
              in_stack_fffffffffffffc30 = pPVar12;
              if (!bVar2) {
                local_8 = (Regexp *)0x0;
                goto LAB_0025201b;
              }
            }
          }
          else {
            pcVar6 = StringPiece::operator[](local_98,1);
            if (*pcVar6 == 'A') {
              bVar2 = ParseState::PushSimpleOp
                                (in_stack_fffffffffffffc00,
                                 (RegexpOp)((ulong)in_stack_fffffffffffffbf8 >> 0x20));
              if (!bVar2) {
                local_8 = (Regexp *)0x0;
                goto LAB_0025201b;
              }
              StringPiece::remove_prefix(local_98,2);
            }
            else {
              pcVar6 = StringPiece::operator[](local_98,1);
              if (*pcVar6 == 'z') {
                bVar2 = ParseState::PushSimpleOp
                                  (in_stack_fffffffffffffc00,
                                   (RegexpOp)((ulong)in_stack_fffffffffffffbf8 >> 0x20));
                if (!bVar2) {
                  local_8 = (Regexp *)0x0;
                  goto LAB_0025201b;
                }
                StringPiece::remove_prefix(local_98,2);
              }
              else {
                in_stack_fffffffffffffcb8 = (ParseState *)StringPiece::operator[](local_98,1);
                if ((char)in_stack_fffffffffffffcb8->flags_ == (NonGreedy|Literal|FoldCase)) {
                  in_stack_fffffffffffffcb7 =
                       ParseState::PushSimpleOp
                                 (in_stack_fffffffffffffc00,
                                  (RegexpOp)((ulong)in_stack_fffffffffffffbf8 >> 0x20));
                  if (!(bool)in_stack_fffffffffffffcb7) {
                    local_8 = (Regexp *)0x0;
                    goto LAB_0025201b;
                  }
                  StringPiece::remove_prefix(local_98,2);
                }
                else {
                  in_stack_fffffffffffffca8 = (Regexp **)StringPiece::operator[](local_98,1);
                  if (*(char *)in_stack_fffffffffffffca8 != 'Q') goto LAB_00251aff;
                  StringPiece::remove_prefix(local_98,2);
                  while (in_stack_fffffffffffffca0 = (RegexpStatus *)StringPiece::size(local_98),
                        in_stack_fffffffffffffca0 != (RegexpStatus *)0x0) {
                    sVar5 = StringPiece::size(local_98);
                    if (((1 < sVar5) &&
                        (pcVar6 = StringPiece::operator[](local_98,0), *pcVar6 == '\\')) &&
                       (pcVar6 = StringPiece::operator[](local_98,1), *pcVar6 == 'E')) {
                      StringPiece::remove_prefix(local_98,2);
                      break;
                    }
                    iVar4 = StringPieceToRune((Rune *)in_stack_fffffffffffffc28,
                                              (StringPiece *)
                                              CONCAT44(in_stack_fffffffffffffc24,
                                                       in_stack_fffffffffffffc20),
                                              (RegexpStatus *)
                                              CONCAT44(in_stack_fffffffffffffc1c,
                                                       in_stack_fffffffffffffc18));
                    if (iVar4 < 0) {
                      local_8 = (Regexp *)0x0;
                      goto LAB_0025201b;
                    }
                    bVar2 = ParseState::PushLiteral
                                      ((ParseState *)
                                       CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
                                       ,(Rune)((ulong)in_stack_fffffffffffffc30 >> 0x20));
                    if (!bVar2) {
                      local_8 = (Regexp *)0x0;
                      goto LAB_0025201b;
                    }
                  }
                }
              }
            }
          }
        }
        else {
          StringPiece::operator[](local_98,1);
          bVar2 = ParseState::PushWordBoundary
                            (in_stack_fffffffffffffbe8,(bool)in_stack_fffffffffffffbe7);
          if (!bVar2) {
            local_8 = (Regexp *)0x0;
            goto LAB_0025201b;
          }
          StringPiece::remove_prefix(local_98,2);
        }
        break;
      case (ParseState *)0x3a:
        bVar2 = ParseState::PushCarat(in_stack_fffffffffffffbd8);
        if (!bVar2) {
          local_8 = (Regexp *)0x0;
          goto LAB_0025201b;
        }
        StringPiece::remove_prefix(local_98,1);
        break;
      case (ParseState *)0x57:
        local_158.data_ = local_98[0].data_;
        local_158.size_ = local_98[0].size_;
        bVar2 = MaybeParseRepetition
                          ((StringPiece *)in_stack_fffffffffffffbf8,
                           (int *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                           (int *)in_stack_fffffffffffffbe8);
        if (bVar2) {
          local_159 = 0;
          PVar3 = ParseState::flags(&local_70);
          PVar3 = operator&(PVar3,PerlX);
          if (PVar3 != NoParseFlags) {
            sVar5 = StringPiece::size(local_98);
            if ((sVar5 != 0) && (pcVar6 = StringPiece::operator[](local_98,0), *pcVar6 == '?')) {
              local_159 = 1;
              StringPiece::remove_prefix(local_98,1);
            }
            sVar5 = StringPiece::size(&local_c8);
            if (sVar5 != 0) {
              RegexpStatus::set_code((RegexpStatus *)local_40.stacktop_,kRegexpRepeatOp);
              pRVar1 = local_40.stacktop_;
              pcVar7 = StringPiece::data(&local_c8);
              pcVar8 = StringPiece::data(local_98);
              pcVar9 = StringPiece::data(&local_c8);
              StringPiece::StringPiece(&local_170,pcVar7,(long)pcVar8 - (long)pcVar9);
              RegexpStatus::set_error_arg((RegexpStatus *)pRVar1,&local_170);
              local_8 = (Regexp *)0x0;
              goto LAB_0025201b;
            }
          }
          pcVar7 = StringPiece::data(&local_158);
          pcVar8 = StringPiece::data(local_98);
          pcVar9 = StringPiece::data(&local_158);
          StringPiece::StringPiece(&local_180,pcVar7,(long)pcVar8 - (long)pcVar9);
          local_158.data_ = local_180.data_;
          local_158.size_ = local_180.size_;
          bVar2 = ParseState::PushRepetition
                            (in_stack_fffffffffffffc48,in_stack_fffffffffffffc44,
                             in_stack_fffffffffffffc40,
                             (StringPiece *)
                             CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                             SUB81((ulong)in_stack_fffffffffffffc30 >> 0x38,0));
          if (!bVar2) {
            local_8 = (Regexp *)0x0;
            goto LAB_0025201b;
          }
          local_d8.data_ = local_158.data_;
          local_d8.size_ = local_158.size_;
        }
        else {
          bVar2 = ParseState::PushLiteral
                            ((ParseState *)
                             CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                             (Rune)((ulong)in_stack_fffffffffffffc30 >> 0x20));
          if (!bVar2) {
            local_8 = (Regexp *)0x0;
            goto LAB_0025201b;
          }
          StringPiece::remove_prefix(local_98,1);
        }
        break;
      case (ParseState *)0x58:
        bVar2 = ParseState::DoVerticalBar(in_stack_fffffffffffffbf8);
        if (!bVar2) {
          local_8 = (Regexp *)0x0;
          goto LAB_0025201b;
        }
        StringPiece::remove_prefix(local_98,1);
      }
      local_c8.data_ = local_d8.data_;
      local_c8.size_ = local_d8.size_;
    }
    local_8 = ParseState::DoFinish(in_stack_fffffffffffffbe8);
  }
  else {
    do {
      sVar5 = StringPiece::size(local_98);
      if (sVar5 == 0) {
        local_8 = ParseState::DoFinish(in_stack_fffffffffffffbe8);
        goto LAB_0025201b;
      }
      iVar4 = StringPieceToRune((Rune *)in_stack_fffffffffffffc28,
                                (StringPiece *)
                                CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                                (RegexpStatus *)
                                CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
      if (iVar4 < 0) {
        local_8 = (Regexp *)0x0;
        goto LAB_0025201b;
      }
      bVar2 = ParseState::PushLiteral
                        ((ParseState *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
                         ,(Rune)((ulong)in_stack_fffffffffffffc30 >> 0x20));
    } while (bVar2);
    local_8 = (Regexp *)0x0;
  }
LAB_0025201b:
  local_b8 = 1;
  ParseState::~ParseState
            ((ParseState *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
  RegexpStatus::~RegexpStatus
            ((RegexpStatus *)
             CONCAT17(in_stack_fffffffffffffbe7,
                      CONCAT16(in_stack_fffffffffffffbe6,in_stack_fffffffffffffbe0)));
  return local_8;
}

Assistant:

Regexp* Regexp::Parse(const StringPiece& s, ParseFlags global_flags,
                      RegexpStatus* status) {
  // Make status non-NULL (easier on everyone else).
  RegexpStatus xstatus;
  if (status == NULL)
    status = &xstatus;

  ParseState ps(global_flags, s, status);
  StringPiece t = s;

  // Convert regexp to UTF-8 (easier on the rest of the parser).
  if (global_flags & Latin1) {
    std::string* tmp = new std::string;
    ConvertLatin1ToUTF8(t, tmp);
    status->set_tmp(tmp);
    t = *tmp;
  }

  if (global_flags & Literal) {
    // Special parse loop for literal string.
    while (t.size() > 0) {
      Rune r;
      if (StringPieceToRune(&r, &t, status) < 0)
        return NULL;
      if (!ps.PushLiteral(r))
        return NULL;
    }
    return ps.DoFinish();
  }

  StringPiece lastunary = StringPiece();
  while (t.size() > 0) {
    StringPiece isunary = StringPiece();
    switch (t[0]) {
      default: {
        Rune r;
        if (StringPieceToRune(&r, &t, status) < 0)
          return NULL;
        if (!ps.PushLiteral(r))
          return NULL;
        break;
      }

      case '(':
        // "(?" introduces Perl escape.
        if ((ps.flags() & PerlX) && (t.size() >= 2 && t[1] == '?')) {
          // Flag changes and non-capturing groups.
          if (!ps.ParsePerlFlags(&t))
            return NULL;
          break;
        }
        if (ps.flags() & NeverCapture) {
          if (!ps.DoLeftParenNoCapture())
            return NULL;
        } else {
          if (!ps.DoLeftParen(StringPiece()))
            return NULL;
        }
        t.remove_prefix(1);  // '('
        break;

      case '|':
        if (!ps.DoVerticalBar())
          return NULL;
        t.remove_prefix(1);  // '|'
        break;

      case ')':
        if (!ps.DoRightParen())
          return NULL;
        t.remove_prefix(1);  // ')'
        break;

      case '^':  // Beginning of line.
        if (!ps.PushCarat())
          return NULL;
        t.remove_prefix(1);  // '^'
        break;

      case '$':  // End of line.
        if (!ps.PushDollar())
          return NULL;
        t.remove_prefix(1);  // '$'
        break;

      case '.':  // Any character (possibly except newline).
        if (!ps.PushDot())
          return NULL;
        t.remove_prefix(1);  // '.'
        break;

      case '[': {  // Character class.
        Regexp* re;
        if (!ps.ParseCharClass(&t, &re, status))
          return NULL;
        if (!ps.PushRegexp(re))
          return NULL;
        break;
      }

      case '*': {  // Zero or more.
        RegexpOp op;
        op = kRegexpStar;
        goto Rep;
      case '+':  // One or more.
        op = kRegexpPlus;
        goto Rep;
      case '?':  // Zero or one.
        op = kRegexpQuest;
        goto Rep;
      Rep:
        StringPiece opstr = t;
        bool nongreedy = false;
        t.remove_prefix(1);  // '*' or '+' or '?'
        if (ps.flags() & PerlX) {
          if (t.size() > 0 && t[0] == '?') {
            nongreedy = true;
            t.remove_prefix(1);  // '?'
          }
          if (lastunary.size() > 0) {
            // In Perl it is not allowed to stack repetition operators:
            //   a** is a syntax error, not a double-star.
            // (and a++ means something else entirely, which we don't support!)
            status->set_code(kRegexpRepeatOp);
            status->set_error_arg(StringPiece(
                lastunary.data(),
                static_cast<size_t>(t.data() - lastunary.data())));
            return NULL;
          }
        }
        opstr = StringPiece(opstr.data(),
                            static_cast<size_t>(t.data() - opstr.data()));
        if (!ps.PushRepeatOp(op, opstr, nongreedy))
          return NULL;
        isunary = opstr;
        break;
      }

      case '{': {  // Counted repetition.
        int lo, hi;
        StringPiece opstr = t;
        if (!MaybeParseRepetition(&t, &lo, &hi)) {
          // Treat like a literal.
          if (!ps.PushLiteral('{'))
            return NULL;
          t.remove_prefix(1);  // '{'
          break;
        }
        bool nongreedy = false;
        if (ps.flags() & PerlX) {
          if (t.size() > 0 && t[0] == '?') {
            nongreedy = true;
            t.remove_prefix(1);  // '?'
          }
          if (lastunary.size() > 0) {
            // Not allowed to stack repetition operators.
            status->set_code(kRegexpRepeatOp);
            status->set_error_arg(StringPiece(
                lastunary.data(),
                static_cast<size_t>(t.data() - lastunary.data())));
            return NULL;
          }
        }
        opstr = StringPiece(opstr.data(),
                            static_cast<size_t>(t.data() - opstr.data()));
        if (!ps.PushRepetition(lo, hi, opstr, nongreedy))
          return NULL;
        isunary = opstr;
        break;
      }

      case '\\': {  // Escaped character or Perl sequence.
        // \b and \B: word boundary or not
        if ((ps.flags() & Regexp::PerlB) &&
            t.size() >= 2 && (t[1] == 'b' || t[1] == 'B')) {
          if (!ps.PushWordBoundary(t[1] == 'b'))
            return NULL;
          t.remove_prefix(2);  // '\\', 'b'
          break;
        }

        if ((ps.flags() & Regexp::PerlX) && t.size() >= 2) {
          if (t[1] == 'A') {
            if (!ps.PushSimpleOp(kRegexpBeginText))
              return NULL;
            t.remove_prefix(2);  // '\\', 'A'
            break;
          }
          if (t[1] == 'z') {
            if (!ps.PushSimpleOp(kRegexpEndText))
              return NULL;
            t.remove_prefix(2);  // '\\', 'z'
            break;
          }
          // Do not recognize \Z, because this library can't
          // implement the exact Perl/PCRE semantics.
          // (This library treats "(?-m)$" as \z, even though
          // in Perl and PCRE it is equivalent to \Z.)

          if (t[1] == 'C') {  // \C: any byte [sic]
            if (!ps.PushSimpleOp(kRegexpAnyByte))
              return NULL;
            t.remove_prefix(2);  // '\\', 'C'
            break;
          }

          if (t[1] == 'Q') {  // \Q ... \E: the ... is always literals
            t.remove_prefix(2);  // '\\', 'Q'
            while (t.size() > 0) {
              if (t.size() >= 2 && t[0] == '\\' && t[1] == 'E') {
                t.remove_prefix(2);  // '\\', 'E'
                break;
              }
              Rune r;
              if (StringPieceToRune(&r, &t, status) < 0)
                return NULL;
              if (!ps.PushLiteral(r))
                return NULL;
            }
            break;
          }
        }

        if (t.size() >= 2 && (t[1] == 'p' || t[1] == 'P')) {
          Regexp* re = new Regexp(kRegexpCharClass, ps.flags() & ~FoldCase);
          re->ccb_ = new CharClassBuilder;
          switch (ParseUnicodeGroup(&t, ps.flags(), re->ccb_, status)) {
            case kParseOk:
              if (!ps.PushRegexp(re))
                return NULL;
              goto Break2;
            case kParseError:
              re->Decref();
              return NULL;
            case kParseNothing:
              re->Decref();
              break;
          }
        }

        const UGroup *g = MaybeParsePerlCCEscape(&t, ps.flags());
        if (g != NULL) {
          Regexp* re = new Regexp(kRegexpCharClass, ps.flags() & ~FoldCase);
          re->ccb_ = new CharClassBuilder;
          AddUGroup(re->ccb_, g, g->sign, ps.flags());
          if (!ps.PushRegexp(re))
            return NULL;
          break;
        }

        Rune r;
        if (!ParseEscape(&t, &r, status, ps.rune_max()))
          return NULL;
        if (!ps.PushLiteral(r))
          return NULL;
        break;
      }
    }
  Break2:
    lastunary = isunary;
  }
  return ps.DoFinish();
}